

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_RET(Context *ctx)

{
  Context *ctx_local;
  
  push_output(ctx,&ctx->postflight);
  output_line(ctx,"}");
  output_blank_line(ctx);
  set_output(ctx,&ctx->subroutines);
  return;
}

Assistant:

static void emit_METAL_RET(Context *ctx)
{
    // thankfully, the MSDN specs say a RET _has_ to end a function...no
    //  early returns. So if you hit one, you know you can safely close
    //  a high-level function.
    push_output(ctx, &ctx->postflight);
    output_line(ctx, "}");
    output_blank_line(ctx);
    set_output(ctx, &ctx->subroutines);  // !!! FIXME: is this for LABEL? Maybe set it there so we don't allocate unnecessarily.
}